

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc.c
# Opt level: O0

int32_t ll_antenna_set(uint8_t ant)

{
  _Bool _Var1;
  int32_t local_18;
  int32_t ret;
  uint8_t ant_local;
  
  if ((ant == '\x01') || (ant == '\x02')) {
    _Var1 = transport_mutex_grab();
    if (_Var1) {
      _ll_ifc_msg_buff[0] = ant;
      local_18 = hal_read_write(OP_ANTENNA_SET,_ll_ifc_msg_buff,1,(uint8_t *)0x0,0);
      transport_mutex_release();
      if (-1 < local_18) {
        local_18 = 0;
      }
      ret = local_18;
    }
    else {
      ret = -0x71;
    }
  }
  else {
    ret = -0x65;
  }
  return ret;
}

Assistant:

int32_t ll_antenna_set(uint8_t ant)
{
    if((ant == 1) || (ant == 2))
    {
        if (!(transport_mutex_grab()))
        {
            return LL_IFC_ERROR_HAL_CALL_FAILED;
        }

        _ll_ifc_msg_buff[0] = ant;

        int32_t ret = hal_read_write(OP_ANTENNA_SET, &_ll_ifc_msg_buff[0], 1, NULL, 0);

        transport_mutex_release();

        return (ret >= 0) ? LL_IFC_ACK : ret;
    }
    else
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }
}